

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *field)

{
  Export *pEVar1;
  ExportModuleField *pEVar2;
  iterator __position;
  long lVar3;
  ModuleFieldList *pMVar4;
  Export *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pEVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  pEVar1 = (Export *)(pEVar2 + 0x40);
  local_48 = *(Export **)(pEVar2 + 0x18);
  uStack_40 = *(undefined4 *)(pEVar2 + 0x20);
  uStack_3c = *(undefined4 *)(pEVar2 + 0x24);
  local_38 = *(undefined4 *)(pEVar2 + 0x28);
  uStack_34 = *(undefined4 *)(pEVar2 + 0x2c);
  uStack_30 = *(undefined4 *)(pEVar2 + 0x30);
  uStack_2c = *(undefined4 *)(pEVar2 + 0x34);
  local_28 = (undefined4)((ulong)(*(long *)&this->field_0xd8 - *(long *)&this->exports) >> 3);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::__cxx11::string&,wabt::Binding>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->export_bindings,0,pEVar1,&local_48);
  __position._M_current = *(Export ***)&this->field_0xd8;
  local_48 = pEVar1;
  if (__position._M_current == *(Export ***)&this->field_0xe0) {
    std::vector<wabt::Export*,std::allocator<wabt::Export*>>::_M_realloc_insert<wabt::Export*>
              ((vector<wabt::Export*,std::allocator<wabt::Export*>> *)&this->exports,__position,
               &local_48);
  }
  else {
    *__position._M_current = pEVar1;
    *(long *)&this->field_0xd8 = *(long *)&this->field_0xd8 + 8;
  }
  pEVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl = (ExportModuleField *)0x0;
  if ((*(long *)(pEVar2 + 0x10) == 0) && (*(long *)(pEVar2 + 8) == 0)) {
    lVar3 = *(long *)&this->field_0x48;
    if (lVar3 == 0) {
      pMVar4 = &this->fields;
    }
    else {
      *(long *)(pEVar2 + 0x10) = lVar3;
      pMVar4 = (ModuleFieldList *)(lVar3 + 8);
    }
    *(ExportModuleField **)pMVar4 = pEVar2;
    *(ExportModuleField **)&this->field_0x48 = pEVar2;
    *(long *)&this->field_0x50 = *(long *)&this->field_0x50 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<ExportModuleField> field) {
  // Exported names are allowed to be empty.
  Export& export_ = field->export_;
  export_bindings.emplace(export_.name, Binding(field->loc, exports.size()));
  exports.push_back(&export_);
  fields.push_back(std::move(field));
}